

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O2

void uc_init_mips(uc_struct_conflict3 *uc)

{
  uc->reg_read_m68k = reg_read_mips;
  uc->reg_write_m68k = reg_write_mips;
  uc->reg_reset = reg_reset;
  uc->release = mips_release;
  uc->set_pc = mips_set_pc;
  uc->get_pc = mips_get_pc;
  uc->cpus_init = mips_cpus_init;
  uc->cpu_context_size = 0x2bbc;
  uc->write_mem = cpu_physical_mem_write;
  uc->read_mem = cpu_physical_mem_read;
  uc->tcg_exec_init_m68k = tcg_exec_init_mips;
  uc->cpu_exec_init_all_m68k = cpu_exec_init_all_mips;
  uc->vm_start_m68k = vm_start_mips;
  uc->memory_map_m68k = memory_map_mips;
  uc->memory_map_ptr_m68k = memory_map_ptr_mips;
  uc->memory_unmap_m68k = memory_unmap_mips;
  uc->memory_moveout_m68k = memory_moveout_mips;
  uc->memory_movein_m68k = memory_movein_mips;
  uc->readonly_mem = memory_region_set_readonly_mips;
  uc->target_page = target_page_init;
  uc->softfloat_initialize = softfloat_init_mips;
  uc->tcg_flush_tlb = tcg_flush_softmmu_tlb_mips;
  uc->memory_map_io_m68k = memory_map_io_mips;
  uc->set_tlb = uc_set_tlb;
  uc->memory_mapping = find_memory_mapping_mips;
  uc->memory_filter_subregions = memory_region_filter_subregions_mips;
  uc->memory_cow_m68k = memory_cow_mips;
  return;
}

Assistant:

DEFAULT_VISIBILITY
void uc_init(struct uc_struct *uc)
{
    uc->reg_read = reg_read;
    uc->reg_write = reg_write;
    uc->reg_reset = reg_reset;
    uc->release = mips_release;
    uc->set_pc = mips_set_pc;
    uc->get_pc = mips_get_pc;
    uc->cpus_init = mips_cpus_init;
    uc->cpu_context_size = offsetof(CPUMIPSState, end_reset_fields);
    uc_common_init(uc);
}